

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void compile_gram(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *grams,uint32_t *dest,char *descriptor,bool quiet)

{
  uint32_t *puVar1;
  byte bVar2;
  pointer pcVar3;
  char *pcVar4;
  uint32_t uVar5;
  pointer pbVar6;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  string ngram;
  byte local_5d;
  undefined4 local_5c;
  char *local_58;
  byte *local_50;
  long local_48;
  byte local_40 [16];
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,quiet);
  pbVar6 = (grams->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((grams->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar6) {
    uVar10 = 0;
    local_58 = descriptor;
    do {
      local_50 = local_40;
      pcVar3 = pbVar6[uVar10]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + pbVar6[uVar10]._M_string_length);
      bVar2 = *local_50;
      if ((int)(char)bVar2 - 0x30U < 10) {
        uVar5 = atoi((char *)local_50);
        if ((char)local_5c == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Generating ",0xb);
          poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-",1);
          pcVar4 = local_58;
          if (local_58 == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
          }
          else {
            sVar8 = strlen(local_58);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar4,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," for all namespaces.",0x14);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        lVar9 = 0;
        do {
          puVar1 = dest + lVar9;
          *puVar1 = uVar5;
          puVar1[1] = uVar5;
          puVar1[2] = uVar5;
          puVar1[3] = uVar5;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x100);
      }
      else if (local_48 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"You must specify the namespace index before the n",0x31);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
      else {
        uVar5 = atoi((char *)(local_50 + 1));
        dest[bVar2] = uVar5;
        if ((char)local_5c == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Generating ",0xb);
          poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-",1);
          pcVar4 = local_58;
          if (local_58 == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
          }
          else {
            sVar8 = strlen(local_58);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar4,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," for ",5);
          local_5d = *local_50;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_5d,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," namespaces.",0xc);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar10 = uVar10 + 1;
      pbVar6 = (grams->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(grams->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5)
            );
  }
  return;
}

Assistant:

void compile_gram(vector<string> grams, uint32_t* dest, char* descriptor, bool quiet)
{
  for (size_t i = 0; i < grams.size(); i++)
  {
    string ngram = grams[i];
    if (isdigit(ngram[0]))
    {
      int n = atoi(ngram.c_str());
      if (!quiet)
        cerr << "Generating " << n << "-" << descriptor << " for all namespaces." << endl;
      for (size_t j = 0; j < 256; j++) dest[j] = n;
    }
    else if (ngram.size() == 1)
      cout << "You must specify the namespace index before the n" << endl;
    else
    {
      int n = atoi(ngram.c_str() + 1);
      dest[(uint32_t)(unsigned char)*ngram.c_str()] = n;
      if (!quiet)
        cerr << "Generating " << n << "-" << descriptor << " for " << ngram[0] << " namespaces." << endl;
    }
  }
}